

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::IGXMLScanner::scanEndTag(IGXMLScanner *this,bool *gotData)

{
  ElemStack *this_00;
  XMLBuffer *this_01;
  ReaderMgr *pRVar1;
  IdentityConstraintHandler *this_02;
  SchemaElementDecl *elem;
  XMLElementDecl *pXVar2;
  XMLDocumentHandler *pXVar3;
  ValueStackOf<bool> *this_03;
  Grammar *pGVar4;
  bool bVar5;
  int iVar6;
  GrammarType GVar7;
  StackElem *pSVar8;
  XMLCh *toSkip;
  XMLCh *pXVar9;
  ComplexTypeInfo *pCVar10;
  DatatypeValidator *pDVar11;
  XMLCh *text2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar12;
  RuntimeException *this_04;
  XMLSize_t XVar13;
  uint *puVar14;
  XMLValidator *pXVar15;
  Codes toEmit;
  bool local_45;
  uint local_44;
  XMLCh *local_40;
  XMLSize_t failure;
  undefined4 extraout_var;
  
  *gotData = true;
  XVar13 = (this->super_XMLScanner).fElemStack.fStackTop;
  if (XVar13 == 0) {
    XMLScanner::emitError(&this->super_XMLScanner,MoreEndThanStartTags);
    ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_04,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
               ,0x3ac,Scan_UnbalancedStartEnd,(this->super_XMLScanner).fMemoryManager);
    goto LAB_002a643c;
  }
  if ((this->super_XMLScanner).fDoNamespaces == true) {
    puVar14 = &(this->super_XMLScanner).fElemStack.fStack[XVar13 - 1]->fCurrentURI;
  }
  else {
    puVar14 = &(this->super_XMLScanner).fEmptyNamespaceId;
  }
  this_00 = &(this->super_XMLScanner).fElemStack;
  local_44 = *puVar14;
  if (this->fGrammarType == SchemaGrammarType) {
    toSkip = (this->super_XMLScanner).fElemStack.fStack[XVar13 - 1]->fSchemaElemName;
    pSVar8 = ElemStack::topElement(this_00);
  }
  else {
    pSVar8 = ElemStack::topElement(this_00);
    toSkip = XMLElementDecl::getFullName(pSVar8->fThisElement);
  }
  pRVar1 = &(this->super_XMLScanner).fReaderMgr;
  bVar5 = ReaderMgr::skippedStringLong(pRVar1,toSkip);
  if (!bVar5) {
    XMLScanner::emitError
              (&this->super_XMLScanner,ExpectedEndOfTagX,toSkip,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
    ReaderMgr::skipPastChar(pRVar1,L'>');
    ElemStack::popTop(this_00);
    return;
  }
  if (pSVar8->fReaderNum != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
    XMLScanner::emitError(&this->super_XMLScanner,PartialTagMarkupError);
  }
  ReaderMgr::skipPastSpaces(pRVar1);
  bVar5 = ReaderMgr::skippedChar(pRVar1,L'>');
  if (!bVar5) {
    pXVar9 = XMLElementDecl::getFullName(pSVar8->fThisElement);
    XMLScanner::emitError
              (&this->super_XMLScanner,UnterminatedEndTag,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  if (this->fGrammarType == SchemaGrammarType) {
    bVar5 = ValueStackOf<bool>::pop(this->fErrorStack);
    (this->fPSVIElemContext).fErrorOccurred = bVar5;
    if (((this->super_XMLScanner).fValidate == true) &&
       (pSVar8->fThisElement->fCreateReason == Declared)) {
      pCVar10 = SchemaValidator::getCurrentTypeInfo
                          ((SchemaValidator *)(this->super_XMLScanner).fValidator);
      (this->fPSVIElemContext).fCurrentTypeInfo = pCVar10;
      if (pCVar10 == (ComplexTypeInfo *)0x0) {
        pDVar11 = (DatatypeValidator *)(this->super_XMLScanner).fValidator[2]._vptr_XMLValidator;
      }
      else {
        pDVar11 = (DatatypeValidator *)0x0;
      }
      (this->fPSVIElemContext).fCurrentDV = pDVar11;
      if ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) {
        pXVar15 = (this->super_XMLScanner).fValidator;
        pRVar1 = pXVar15[3].fReaderMgr;
        *(XMLCh *)((long)&(pRVar1->super_Locator)._vptr_Locator +
                  (long)pXVar15[2].fErrorReporter * 2) = L'\0';
        (this->fPSVIElemContext).fNormalizedValue = (XMLCh *)pRVar1;
        bVar5 = XMLString::equals((XMLCh *)pRVar1,L"");
        if (bVar5) goto LAB_002a5f7c;
      }
    }
    else {
      (this->fPSVIElemContext).fCurrentDV = (DatatypeValidator *)0x0;
      (this->fPSVIElemContext).fCurrentTypeInfo = (ComplexTypeInfo *)0x0;
LAB_002a5f7c:
      (this->fPSVIElemContext).fNormalizedValue = (XMLCh *)0x0;
    }
  }
  if ((this->super_XMLScanner).fValidate == true) {
    if (this->fGrammarType == DTDGrammarType) {
      if ((pSVar8->fCommentOrPISeen == true) && (*(int *)&pSVar8->fThisElement->field_0x2c == 0)) {
        pXVar15 = (this->super_XMLScanner).fValidator;
        pXVar9 = XMLElementDecl::getFullName(pSVar8->fThisElement);
        XMLValidator::emitError
                  (pXVar15,EmptyElemHasContent,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        if (this->fGrammarType != DTDGrammarType) goto LAB_002a6074;
      }
      if ((pSVar8->fReferenceEscaped == true) && (*(int *)&pSVar8->fThisElement->field_0x2c == 3)) {
        pXVar15 = (this->super_XMLScanner).fValidator;
        pXVar9 = XMLElementDecl::getFullName(pSVar8->fThisElement);
        XMLValidator::emitError
                  (pXVar15,ElemChildrenHasInvalidWS,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
LAB_002a6074:
    pXVar15 = (this->super_XMLScanner).fValidator;
    iVar6 = (*pXVar15->_vptr_XMLValidator[2])(pXVar15,pSVar8->fThisElement,pSVar8->fChildren);
    if ((char)iVar6 == '\0') {
      if (pSVar8->fChildCount == 0) {
        pXVar15 = (this->super_XMLScanner).fValidator;
        iVar6 = (*(pSVar8->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
        pXVar9 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
        toEmit = EmptyNotValidForContent;
LAB_002a60f9:
        text2 = (XMLCh *)0x0;
      }
      else {
        pXVar15 = (this->super_XMLScanner).fValidator;
        if (pSVar8->fChildCount <= failure) {
          iVar6 = (*(pSVar8->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
          pXVar9 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
          toEmit = NotEnoughElemsForCM;
          goto LAB_002a60f9;
        }
        local_40 = QName::getRawName(pSVar8->fChildren[failure]);
        iVar6 = (*(pSVar8->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
        text2 = (XMLCh *)CONCAT44(extraout_var,iVar6);
        toEmit = ElementNotValidForContent;
        pXVar9 = local_40;
      }
      XMLValidator::emitError(pXVar15,toEmit,pXVar9,text2,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    if (this->fGrammarType != SchemaGrammarType) goto LAB_002a6136;
    if (*(char *)&(this->super_XMLScanner).fValidator[5]._vptr_XMLValidator == '\x01') {
      (this->fPSVIElemContext).fErrorOccurred = true;
LAB_002a61f6:
      pDVar11 = (DatatypeValidator *)0x0;
    }
    else {
      pDVar11 = (this->fPSVIElemContext).fCurrentDV;
      if ((pDVar11 == (DatatypeValidator *)0x0) || (pDVar11->fType != Union)) goto LAB_002a61f6;
      iVar6 = (*((this->super_XMLScanner).fValidationContext)->_vptr_ValidationContext[0xb])();
      pDVar11 = (DatatypeValidator *)CONCAT44(extraout_var_02,iVar6);
    }
    if (((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) &&
       (bVar5 = *(bool *)((long)&(this->super_XMLScanner).fValidator[5]._vptr_XMLValidator + 1),
       (this->fPSVIElemContext).fIsSpecified = bVar5, bVar5 == true)) {
      (this->fPSVIElemContext).fNormalizedValue = *(XMLCh **)&pSVar8->fThisElement[1].fCreateReason;
    }
    if (((this->super_XMLScanner).fValidate == true) &&
       (this_02 = this->fICHandler,
       (this_02 != (IdentityConstraintHandler *)0x0 &
       (this->super_XMLScanner).fIdentityConstraintChecking) == 1)) {
      elem = (SchemaElementDecl *)pSVar8->fThisElement;
      pXVar9 = (this->fContent).fBuffer;
      pXVar9[(this->fContent).fIndex] = L'\0';
      IdentityConstraintHandler::deactivateContext
                (this_02,elem,pXVar9,(this->super_XMLScanner).fValidationContext,
                 (this->fPSVIElemContext).fCurrentDV);
    }
  }
  else {
LAB_002a6136:
    pDVar11 = (DatatypeValidator *)0x0;
  }
  ElemStack::popTop(this_00);
  XVar13 = (this->super_XMLScanner).fElemStack.fStackTop;
  GVar7 = this->fGrammarType;
  if (GVar7 == SchemaGrammarType) {
    if ((this->super_XMLScanner).fPSVIHandler == (PSVIHandler *)0x0) {
      GVar7 = SchemaGrammarType;
    }
    else {
      endElementPSVI(this,(SchemaElementDecl *)pSVar8->fThisElement,pDVar11);
      GVar7 = this->fGrammarType;
    }
    (this->super_XMLScanner).fValidator[2].fErrorReporter = (XMLErrorReporter *)0x0;
  }
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    if (GVar7 == SchemaGrammarType) {
      this_01 = &(this->super_XMLScanner).fPrefixBuf;
      if ((long)pSVar8->fPrefixColonPos == 0xffffffffffffffff) {
        this_01->fIndex = 0;
      }
      else {
        XMLBuffer::set(this_01,toSkip,(long)pSVar8->fPrefixColonPos);
      }
    }
    else {
      XMLBuffer::set(&(this->super_XMLScanner).fPrefixBuf,
                     pSVar8->fThisElement->fElementName->fPrefix);
    }
    pXVar2 = pSVar8->fThisElement;
    pXVar3 = (this->super_XMLScanner).fDocHandler;
    (this->super_XMLScanner).fPrefixBuf.fBuffer[(this->super_XMLScanner).fPrefixBuf.fIndex] = L'\0';
    (*pXVar3->_vptr_XMLDocumentHandler[6])(pXVar3,pXVar2,(ulong)local_44,(ulong)(XVar13 == 0));
    GVar7 = this->fGrammarType;
  }
  if ((XVar13 == 0) || (GVar7 != SchemaGrammarType)) {
    *gotData = XVar13 != 0;
    if (XVar13 == 0) {
      return;
    }
  }
  else {
    this_03 = this->fErrorStack;
    if ((this_03->fVector).fCurCount == 0) {
LAB_002a62d7:
      local_45 = (this->fPSVIElemContext).fErrorOccurred;
    }
    else {
      bVar5 = ValueStackOf<bool>::pop(this_03);
      local_45 = true;
      if (!bVar5) goto LAB_002a62d7;
    }
    ValueVectorOf<bool>::addElement(&this_03->fVector,&local_45);
    *gotData = true;
  }
  XVar13 = (this->super_XMLScanner).fElemStack.fStackTop;
  if ((this->super_XMLScanner).fDoNamespaces != true) goto LAB_002a63d6;
  pGVar4 = (this->super_XMLScanner).fElemStack.fStack[XVar13 - 1]->fCurrentGrammar;
  (this->super_XMLScanner).fGrammar = pGVar4;
  GVar7 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[5])();
  this->fGrammarType = GVar7;
  if (GVar7 == SchemaGrammarType) {
    iVar6 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xd])();
    if ((char)iVar6 != '\0') {
      GVar7 = this->fGrammarType;
      goto LAB_002a6353;
    }
    lVar12 = 0x418;
    if ((this->super_XMLScanner).fValidatorFromUser == true) {
      this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (this_04,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                 ,0x4b6,Gen_NoSchemaValidator,(this->super_XMLScanner).fMemoryManager);
      goto LAB_002a643c;
    }
LAB_002a63b0:
    (this->super_XMLScanner).fValidator =
         *(XMLValidator **)
          ((long)&(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler +
          lVar12);
  }
  else {
LAB_002a6353:
    if ((GVar7 == DTDGrammarType) &&
       (iVar6 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xc])(),
       (char)iVar6 == '\0')) {
      lVar12 = 0x410;
      if ((this->super_XMLScanner).fValidatorFromUser == true) {
        this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (this_04,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                   ,0x4bd,Gen_NoDTDValidator,(this->super_XMLScanner).fMemoryManager);
LAB_002a643c:
        __cxa_throw(this_04,&RuntimeException::typeinfo,XMLException::~XMLException);
      }
      goto LAB_002a63b0;
    }
  }
  pXVar15 = (this->super_XMLScanner).fValidator;
  (*pXVar15->_vptr_XMLValidator[0xb])(pXVar15,(this->super_XMLScanner).fGrammar);
  XVar13 = (this->super_XMLScanner).fElemStack.fStackTop;
LAB_002a63d6:
  (this->super_XMLScanner).fValidate =
       (this->super_XMLScanner).fElemStack.fStack[XVar13 - 1]->fValidationFlag;
  return;
}

Assistant:

void IGXMLScanner::scanEndTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the end of the root element.
    gotData = true;

    //  Check if the element stack is empty. If so, then this is an unbalanced
    //  element (i.e. more ends than starts, perhaps because of bad text
    //  causing one to be skipped.)
    if (fElemStack.isEmpty())
    {
        emitError(XMLErrs::MoreEndThanStartTags);
        fReaderMgr.skipPastChar(chCloseAngle);
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_UnbalancedStartEnd, fMemoryManager);
    }

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    unsigned int uriId = (fDoNamespaces)
        ? fElemStack.getCurrentURI() : fEmptyNamespaceId;

    // these get initialized below
    const ElemStack::StackElem* topElem = 0;
    const XMLCh *elemName = 0;

    // Make sure that its the end of the element that we expect
    // special case for schema validation, whose element decls,
    // obviously don't contain prefix information
    if(fGrammarType == Grammar::SchemaGrammarType)
    {
        elemName = fElemStack.getCurrentSchemaElemName();
        topElem = fElemStack.topElement();
    }
    else
    {
        topElem = fElemStack.topElement();
        elemName = topElem->fThisElement->getFullName();
    }
    if (!fReaderMgr.skippedStringLong(elemName))
    {
        emitError
        (
            XMLErrs::ExpectedEndOfTagX
            , elemName
        );
        fReaderMgr.skipPastChar(chCloseAngle);
        fElemStack.popTop();
        return;
    }

    // Make sure we are back on the same reader as where we started
    if (topElem->fReaderNum != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialTagMarkupError);

    // Skip optional whitespace
    fReaderMgr.skipPastSpaces();

    // Make sure we find the closing bracket
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError
        (
            XMLErrs::UnterminatedEndTag
            , topElem->fThisElement->getFullName()
        );
    }

    if (fGrammarType == Grammar::SchemaGrammarType)
    {
        // reset error occurred
        fPSVIElemContext.fErrorOccurred = fErrorStack->pop();
        if (fValidate && topElem->fThisElement->isDeclared())
        {
            fPSVIElemContext.fCurrentTypeInfo = ((SchemaValidator*) fValidator)->getCurrentTypeInfo();
            if(!fPSVIElemContext.fCurrentTypeInfo)
                fPSVIElemContext.fCurrentDV = ((SchemaValidator*) fValidator)->getCurrentDatatypeValidator();
            else
                fPSVIElemContext.fCurrentDV = 0;
            if(fPSVIHandler)
            {
                fPSVIElemContext.fNormalizedValue = ((SchemaValidator*) fValidator)->getNormalizedValue();

                if (XMLString::equals(fPSVIElemContext.fNormalizedValue, XMLUni::fgZeroLenString))
                    fPSVIElemContext.fNormalizedValue = 0;
            }
        }
        else
        {
            fPSVIElemContext.fCurrentDV = 0;
            fPSVIElemContext.fCurrentTypeInfo = 0;
            fPSVIElemContext.fNormalizedValue = 0;
        }
    }

    //  If validation is enabled, then lets pass him the list of children and
    //  this element and let him validate it.
    DatatypeValidator* psviMemberType = 0;
    if (fValidate)
    {

       //
       // XML1.0-3rd
       // Validity Constraint:
       // The declaration matches EMPTY and the element has no content (not even
       // entity references, comments, PIs or white space).
       //
       if ( (fGrammarType == Grammar::DTDGrammarType) &&
            (topElem->fCommentOrPISeen)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Empty))
       {
           fValidator->emitError
               (
               XMLValid::EmptyElemHasContent
               , topElem->fThisElement->getFullName()
               );
       }

       //
       // XML1.0-3rd
       // Validity Constraint:
       //
       // The declaration matches children and the sequence of child elements
       // belongs to the language generated by the regular expression in the
       // content model, with optional white space, comments and PIs
       // (i.e. markup matching production [27] Misc) between the start-tag and
       // the first child element, between child elements, or between the last
       // child element and the end-tag.
       //
       // Note that
       //    a CDATA section containing only white space or
       //    a reference to an entity whose replacement text is character references
       //       expanding to white space do not match the nonterminal S, and hence
       //       cannot appear in these positions; however,
       //    a reference to an internal entity with a literal value consisting
       //       of character references expanding to white space does match S,
       //       since its replacement text is the white space resulting from expansion
       //       of the character references.
       //
       if ( (fGrammarType == Grammar::DTDGrammarType)  &&
            (topElem->fReferenceEscaped)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Children))
       {
           fValidator->emitError
               (
               XMLValid::ElemChildrenHasInvalidWS
               , topElem->fThisElement->getFullName()
               );
       }
        XMLSize_t failure;
        bool res = fValidator->checkContent
        (
            topElem->fThisElement
            , topElem->fChildren
            , topElem->fChildCount
            , &failure
        );

        if (!res)
        {
            //  One of the elements is not valid for the content. NOTE that
            //  if no children were provided but the content model requires
            //  them, it comes back with a zero value. But we cannot use that
            //  to index the child array in this case, and have to put out a
            //  special message.
            if (!topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::EmptyNotValidForContent
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else if (failure >= topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::NotEnoughElemsForCM
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , topElem->fChildren[failure]->getRawName()
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
        }


        if (fGrammarType == Grammar::SchemaGrammarType) {
            if (((SchemaValidator*) fValidator)->getErrorOccurred())
                fPSVIElemContext.fErrorOccurred = true;
            else if (fPSVIElemContext.fCurrentDV && fPSVIElemContext.fCurrentDV->getType() == DatatypeValidator::Union)
                psviMemberType = fValidationContext->getValidatingMemberType();

            if (fPSVIHandler)
            {
                fPSVIElemContext.fIsSpecified = ((SchemaValidator*) fValidator)->getIsElemSpecified();
                if(fPSVIElemContext.fIsSpecified)
                    fPSVIElemContext.fNormalizedValue = ((SchemaElementDecl *)topElem->fThisElement)->getDefaultValue();
            }

            // call matchers and de-activate context
            if (toCheckIdentityConstraint())
            {
                fICHandler->deactivateContext
                             (
                              (SchemaElementDecl *) topElem->fThisElement
                            , fContent.getRawBuffer()
                            , fValidationContext
                            , fPSVIElemContext.fCurrentDV
                             );
            }

        }
    }

    // QName dv needed topElem to resolve URIs on the checkContent
    fElemStack.popTop();

    // See if it was the root element, to avoid multiple calls below
    const bool isRoot = fElemStack.isEmpty();

    if (fGrammarType == Grammar::SchemaGrammarType)
    {
        if (fPSVIHandler)
        {
            endElementPSVI(
                (SchemaElementDecl*)topElem->fThisElement, psviMemberType);
        }
        // now we can reset the datatype buffer, since the
        // application has had a chance to copy the characters somewhere else
        ((SchemaValidator *)fValidator)->clearDatatypeBuffer();
    }

    // If we have a doc handler, tell it about the end tag
    if (fDocHandler)
    {
        if (fGrammarType == Grammar::SchemaGrammarType) {
            if (topElem->fPrefixColonPos != -1)
                fPrefixBuf.set(elemName, topElem->fPrefixColonPos);
            else
                fPrefixBuf.reset();
        }
        else {
            fPrefixBuf.set(topElem->fThisElement->getElementName()->getPrefix());
        }
        fDocHandler->endElement
        (
            *topElem->fThisElement
            , uriId
            , isRoot
            , fPrefixBuf.getRawBuffer()
        );
    }

    if (fGrammarType == Grammar::SchemaGrammarType) {
        if (!isRoot)
        {
            // update error information
            fErrorStack->push((fErrorStack->size() && fErrorStack->pop()) || fPSVIElemContext.fErrorOccurred);


        }
    }

    // If this was the root, then done with content
    gotData = !isRoot;

    if (gotData) {
        if (fDoNamespaces) {
            // Restore the grammar
            fGrammar = fElemStack.getCurrentGrammar();
            fGrammarType = fGrammar->getGrammarType();
            if (fGrammarType == Grammar::SchemaGrammarType && !fValidator->handlesSchema()) {
                if (fValidatorFromUser)
                    ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoSchemaValidator, fMemoryManager);
                else {
                    fValidator = fSchemaValidator;
                }
            }
            else if (fGrammarType == Grammar::DTDGrammarType && !fValidator->handlesDTD()) {
                if (fValidatorFromUser)
                    ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoDTDValidator, fMemoryManager);
                else {
                    fValidator = fDTDValidator;
                }
            }

            fValidator->setGrammar(fGrammar);
        }

        // Restore the validation flag
        fValidate = fElemStack.getValidationFlag();
    }
}